

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O1

void __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>_>_>_>
::sherwood_v3_table(sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>_>_>_>
                    *this,initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>_>
                          il,size_type bucket_count,
                   Hasher<std::basic_string_view<char,_std::char_traits<char>_>_> *hash,
                   equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *equal,
                   allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>_>
                   *alloc)

{
  sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>_>
  *psVar1;
  size_t num_buckets;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>
  *key;
  long lVar2;
  
  num_buckets = il._M_len;
  key = il._M_array;
  psVar1 = empty_default_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::DiagCode,std::allocator<slang::DiagCode>>>>
                     ();
  this->entries = psVar1;
  this->num_slots_minus_one = 0;
  this->hash_policy = '?';
  this->max_lookups = '\x03';
  this->_max_load_factor = 0.5;
  this->num_elements = 0;
  rehash(this,bucket_count);
  if (bucket_count == 0) {
    rehash(this,num_buckets);
  }
  if (num_buckets != 0) {
    lVar2 = num_buckets * 0x28;
    do {
      sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::DiagCode,std::allocator<slang::DiagCode>>>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::DiagCode,std::allocator<slang::DiagCode>>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::DiagCode,std::allocator<slang::DiagCode>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::DiagCode,std::allocator<slang::DiagCode>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::DiagCode,std::allocator<slang::DiagCode>>>>>>
      ::
      emplace<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::DiagCode,std::allocator<slang::DiagCode>>>const&>
                ((sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::DiagCode,std::allocator<slang::DiagCode>>>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::DiagCode,std::allocator<slang::DiagCode>>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::DiagCode,std::allocator<slang::DiagCode>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::DiagCode,std::allocator<slang::DiagCode>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::DiagCode,std::allocator<slang::DiagCode>>>>>>
                  *)this,key);
      key = key + 1;
      lVar2 = lVar2 + -0x28;
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

sherwood_v3_table(std::initializer_list<T> il, size_type bucket_count = 0, const ArgumentHash & hash = ArgumentHash(), const ArgumentEqual & equal = ArgumentEqual(), const ArgumentAlloc & alloc = ArgumentAlloc())
        : sherwood_v3_table(bucket_count, hash, equal, alloc)
    {
        if (bucket_count == 0)
            rehash(il.size());
        insert(il.begin(), il.end());
    }